

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ba_sparse_matrix.h
# Opt level: O0

SparseMatrix<double> * __thiscall
sfm::ba::SparseMatrix<double>::subtract
          (SparseMatrix<double> *__return_storage_ptr__,SparseMatrix<double> *this,
          SparseMatrix<double> *rhs)

{
  double dVar1;
  invalid_argument *this_00;
  size_t sVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  unsigned_long *__x;
  double local_88;
  value_type local_80;
  ulong local_78;
  size_t id2;
  size_t id1;
  ulong local_60;
  size_t i2_end;
  size_t i1_end;
  size_t i2;
  size_t i1;
  size_t outer;
  size_t num_outer;
  SparseMatrix<double> *local_20;
  SparseMatrix<double> *rhs_local;
  SparseMatrix<double> *this_local;
  SparseMatrix<double> *ret;
  
  local_20 = rhs;
  rhs_local = this;
  this_local = __return_storage_ptr__;
  if ((this->rows == rhs->rows) && (this->cols == rhs->cols)) {
    num_outer._3_1_ = 0;
    SparseMatrix(__return_storage_ptr__,this->rows,this->cols);
    sVar2 = num_non_zero(this);
    sVar3 = num_non_zero(local_20);
    reserve(__return_storage_ptr__,sVar2 + sVar3);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->outer);
    outer = sVar4 - 1;
    for (i1 = 0; i1 < outer; i1 = i1 + 1) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size(&__return_storage_ptr__->values);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&__return_storage_ptr__->outer,i1);
      *pvVar5 = sVar4;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->outer,i1);
      i2 = *pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_20->outer,i1);
      i1_end = *pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->outer,i1 + 1);
      i2_end = *pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_20->outer,i1 + 1);
      local_60 = *pvVar6;
      while (i2 < i2_end || i1_end < local_60) {
        if (i2 < i2_end) {
          if (i1_end < local_60) {
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->inner,i2);
            id2 = *pvVar6;
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_20->inner,i1_end);
            local_78 = *pvVar6;
            if (id2 < local_78) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&this->values,i2);
              std::vector<double,_std::allocator<double>_>::push_back
                        (&__return_storage_ptr__->values,pvVar7);
            }
            else if (local_78 < id2) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_20->values,i1_end);
              local_80 = -*pvVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        (&__return_storage_ptr__->values,&local_80);
            }
            else {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&this->values,i2);
              dVar1 = *pvVar7;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_20->values,i1_end);
              local_88 = dVar1 - *pvVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        (&__return_storage_ptr__->values,&local_88);
            }
            i2 = (i2 + 1) - (ulong)(local_78 < id2);
            i1_end = (i1_end + 1) - (ulong)(id2 < local_78);
            __x = std::min<unsigned_long>(&id2,&local_78);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&__return_storage_ptr__->inner,__x);
          }
          else {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&this->values,i2);
            std::vector<double,_std::allocator<double>_>::push_back
                      (&__return_storage_ptr__->values,pvVar7);
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->inner,i2);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&__return_storage_ptr__->inner,pvVar6);
            i2 = i2 + 1;
          }
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_20->values,i1_end);
          id1 = (size_t)-*pvVar7;
          std::vector<double,_std::allocator<double>_>::push_back
                    (&__return_storage_ptr__->values,(value_type_conflict2 *)&id1);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_20->inner,i1_end);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&__return_storage_ptr__->inner,pvVar6);
          i1_end = i1_end + 1;
        }
      }
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&__return_storage_ptr__->values);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       (&__return_storage_ptr__->outer);
    *pvVar5 = sVar4;
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Incompatible matrix dimensions");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

SparseMatrix<T>
SparseMatrix<T>::subtract (SparseMatrix const& rhs) const
{
    if (this->rows != rhs.rows || this->cols != rhs.cols)
        throw std::invalid_argument("Incompatible matrix dimensions");

    SparseMatrix ret(this->rows, this->cols);
    ret.reserve(this->num_non_zero() + rhs.num_non_zero());

    std::size_t num_outer = this->outer.size() - 1;
    for (std::size_t outer = 0; outer < num_outer; ++outer)
    {
        ret.outer[outer] = ret.values.size();

        std::size_t i1 = this->outer[outer];
        std::size_t i2 = rhs.outer[outer];
        std::size_t const i1_end = this->outer[outer + 1];
        std::size_t const i2_end = rhs.outer[outer + 1];
        while (i1 < i1_end || i2 < i2_end)
        {
            if (i1 >= i1_end)
            {
                ret.values.push_back(-rhs.values[i2]);
                ret.inner.push_back(rhs.inner[i2]);
                i2 += 1;
                continue;
            }
            if (i2 >= i2_end)
            {
                ret.values.push_back(this->values[i1]);
                ret.inner.push_back(this->inner[i1]);
                i1 += 1;
                continue;
            }

            std::size_t id1 = this->inner[i1];
            std::size_t id2 = rhs.inner[i2];

            if (id1 < id2)
                ret.values.push_back(this->values[i1]);
            else if (id2 < id1)
                ret.values.push_back(-rhs.values[i2]);
            else
                ret.values.push_back(this->values[i1] - rhs.values[i2]);

            i1 += static_cast<std::size_t>(id1 <= id2);
            i2 += static_cast<std::size_t>(id2 <= id1);
            ret.inner.push_back(std::min(id1, id2));
        }
    }
    ret.outer.back() = ret.values.size();

    return ret;
}